

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O0

x86XmmReg GenCodeLoadDoubleFromPointerIntoRegister
                    (CodeGenRegVmContext *ctx,x86Reg tempReg,uchar reg,uint offset)

{
  x86XmmReg targetReg;
  x86XmmReg targetReg_3;
  x86XmmReg targetReg_2;
  x86XmmReg targetReg_1;
  uint offset_local;
  uchar reg_local;
  x86Reg tempReg_local;
  CodeGenRegVmContext *ctx_local;
  
  if (reg == '\x03') {
    ctx_local._4_4_ =
         CodeGenGenericContext::FindXmmRegAtMemory(&ctx->ctx,sQWORD,rNONE,1,rEBX,offset,true);
    if (ctx_local._4_4_ == rXmmRegCount) {
      ctx_local._4_4_ = CodeGenGenericContext::GetXmmReg(&ctx->ctx);
      EMIT_OP_REG_RPTR(&ctx->ctx,o_movsd,ctx_local._4_4_,sQWORD,rEBX,offset);
    }
  }
  else if (reg == '\x01') {
    ctx_local._4_4_ =
         CodeGenGenericContext::FindXmmRegAtMemory(&ctx->ctx,sQWORD,rNONE,1,rR15,offset,true);
    if (ctx_local._4_4_ == rXmmRegCount) {
      ctx_local._4_4_ = CodeGenGenericContext::GetXmmReg(&ctx->ctx);
      EMIT_OP_REG_RPTR(&ctx->ctx,o_movsd,ctx_local._4_4_,sQWORD,rR15,offset);
    }
  }
  else if (reg == '\x02') {
    ctx_local._4_4_ =
         CodeGenGenericContext::FindXmmRegAtMemory(&ctx->ctx,sQWORD,rNONE,1,rR14,offset,true);
    if (ctx_local._4_4_ == rXmmRegCount) {
      ctx_local._4_4_ = CodeGenGenericContext::GetXmmReg(&ctx->ctx);
      EMIT_OP_REG_RPTR(&ctx->ctx,o_movsd,ctx_local._4_4_,sQWORD,rR14,offset);
    }
  }
  else {
    EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,tempReg,sQWORD,rEBX,(uint)reg << 3);
    ctx_local._4_4_ =
         CodeGenGenericContext::FindXmmRegAtMemory(&ctx->ctx,sQWORD,rNONE,1,tempReg,offset,true);
    if (ctx_local._4_4_ == rXmmRegCount) {
      ctx_local._4_4_ = CodeGenGenericContext::GetXmmReg(&ctx->ctx);
      EMIT_OP_REG_RPTR(&ctx->ctx,o_movsd,ctx_local._4_4_,sQWORD,tempReg,offset);
    }
  }
  return ctx_local._4_4_;
}

Assistant:

x86XmmReg GenCodeLoadDoubleFromPointerIntoRegister(CodeGenRegVmContext &ctx, x86Reg tempReg, unsigned char reg, unsigned offset)
{
	if(reg == rvrrRegisters)
	{
		x86XmmReg targetReg = ctx.ctx.FindXmmRegAtMemory(sQWORD, rNONE, 1, rREG, offset, true);

		if(targetReg != rXmmRegCount)
			return targetReg;

		targetReg = ctx.ctx.GetXmmReg();

		EMIT_OP_REG_RPTR(ctx.ctx, o_movsd, targetReg, sQWORD, rREG, offset); // Load double value

		return targetReg;
	}

	if(reg == rvrrFrame)
	{
		x86XmmReg targetReg = ctx.ctx.FindXmmRegAtMemory(sQWORD, rNONE, 1, rR15, offset, true);

		if(targetReg != rXmmRegCount)
			return targetReg;

		targetReg = ctx.ctx.GetXmmReg();

		EMIT_OP_REG_RPTR(ctx.ctx, o_movsd, targetReg, sQWORD, rR15, offset); // Load double value

		return targetReg;
	}

	if(reg == rvrrConstants)
	{
		x86XmmReg targetReg = ctx.ctx.FindXmmRegAtMemory(sQWORD, rNONE, 1, rR14, offset, true);

		if(targetReg != rXmmRegCount)
			return targetReg;

		targetReg = ctx.ctx.GetXmmReg();

		EMIT_OP_REG_RPTR(ctx.ctx, o_movsd, targetReg, sQWORD, rR14, offset); // Load double value

		return targetReg;
	}

	EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, tempReg, sQWORD, rREG, reg * 8); // Load source pointer

	x86XmmReg targetReg = ctx.ctx.FindXmmRegAtMemory(sQWORD, rNONE, 1, tempReg, offset, true);

	if(targetReg != rXmmRegCount)
		return targetReg;

	targetReg = ctx.ctx.GetXmmReg();

	EMIT_OP_REG_RPTR(ctx.ctx, o_movsd, targetReg, sQWORD, tempReg, offset); // Load double value

	return targetReg;
}